

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

longlong anon_unknown.dwarf_d9833::StrToLong(char *p)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long local_20;
  unsigned_long_long res;
  char *pcStack_10;
  bool negative;
  char *p_local;
  
  pcStack_10 = p;
  while( true ) {
    bVar2 = false;
    if (*pcStack_10 != '\0') {
      bVar2 = *pcStack_10 < '!';
    }
    if (!bVar2) break;
    pcStack_10 = pcStack_10 + 1;
  }
  cVar1 = *pcStack_10;
  if (cVar1 == '-') {
    pcStack_10 = pcStack_10 + 1;
  }
  local_20 = 0;
  for (; (int)*pcStack_10 - 0x30U < 10; pcStack_10 = pcStack_10 + 1) {
    local_20 = local_20 * 10 + (ulong)((int)*pcStack_10 - 0x30);
  }
  iVar3 = 1;
  if (cVar1 == '-') {
    iVar3 = -1;
  }
  return local_20 * iVar3;
}

Assistant:

long long StrToLong(const char* p)
	{
		while(*p && *p <= ' ')
			p++;

		bool negative = *p == '-';
		if(negative)
			p++;

		unsigned long long res = 0;
		while(unsigned(*p - '0') < 10)
			res = res * 10 + unsigned(*p++ - '0');

		return res * (negative ? -1 : 1);
	}